

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

Enum __thiscall ViconDataStreamSDK::Core::VClient::GetEyeTrackerCount(VClient *this,uint *o_rCount)

{
  Enum EVar1;
  bool bVar2;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_24;
  unique_lock<boost::recursive_mutex> local_20;
  
  local_20.m = &this->m_FrameMutex;
  local_20.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_20);
  local_24 = Success;
  ClientUtils::Clear(o_rCount);
  bVar2 = InitGet(this,&local_24);
  EVar1 = local_24;
  if (bVar2) {
    *o_rCount = (int)((ulong)((long)(this->m_LatestFrame).m_EyeTrackers.
                                    super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_LatestFrame).m_EyeTrackers.
                                   super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  }
  if (local_20.is_locked == true) {
    boost::recursive_mutex::unlock(local_20.m);
  }
  return EVar1;
}

Assistant:

Result::Enum VClient::GetEyeTrackerCount( unsigned int & o_rCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult, o_rCount ) )
  {
    o_rCount = static_cast<unsigned int>( m_LatestFrame.m_EyeTrackers.size() );
  }
  return GetResult;
}